

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

SmallVectorBase<slang::ast::OpaqueInstancePath::Entry> * __thiscall
slang::SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>::operator=
          (SmallVectorBase<slang::ast::OpaqueInstancePath::Entry> *this,
          SmallVectorBase<slang::ast::OpaqueInstancePath::Entry> *rhs)

{
  ulong uVar1;
  bool bVar2;
  Entry *pEVar3;
  unsigned_long uVar4;
  size_type sVar5;
  size_type sVar6;
  iterator pEVar7;
  SmallVectorBase<slang::ast::OpaqueInstancePath::Entry> *pSVar8;
  SmallVectorBase<slang::ast::OpaqueInstancePath::Entry> *in_RSI;
  SmallVectorBase<slang::ast::OpaqueInstancePath::Entry> *in_RDI;
  iterator newEnd;
  Entry *in_stack_ffffffffffffff68;
  SmallVectorBase<slang::ast::OpaqueInstancePath::Entry> *in_stack_ffffffffffffff70;
  SmallVectorBase<slang::ast::OpaqueInstancePath::Entry> *in_stack_ffffffffffffff78;
  SmallVectorBase<slang::ast::OpaqueInstancePath::Entry> *in_stack_ffffffffffffff80;
  
  if (in_RDI != in_RSI) {
    pSVar8 = in_RSI;
    bVar2 = isSmall(in_RSI);
    if (bVar2) {
      uVar1 = in_RDI->len;
      sVar5 = size(in_RSI);
      if (uVar1 < sVar5) {
        sVar5 = capacity(in_RDI);
        sVar6 = size(in_RSI);
        if (sVar5 < sVar6) {
          clear(in_stack_ffffffffffffff70);
          size(in_RSI);
          reserve(in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
        }
        else if (in_RDI->len != 0) {
          in_stack_ffffffffffffff78 =
               (SmallVectorBase<slang::ast::OpaqueInstancePath::Entry> *)begin(in_RSI);
          pEVar7 = begin(in_RSI);
          in_stack_ffffffffffffff80 =
               (SmallVectorBase<slang::ast::OpaqueInstancePath::Entry> *)(pEVar7 + in_RDI->len);
          begin(in_RDI);
          std::ranges::__move_fn::
          operator()<slang::ast::OpaqueInstancePath::Entry_*,_slang::ast::OpaqueInstancePath::Entry_*,_slang::ast::OpaqueInstancePath::Entry_*>
                    ((__move_fn *)in_stack_ffffffffffffff80,(Entry *)in_stack_ffffffffffffff78,
                     (Entry *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        }
        begin(in_RSI);
        pSVar8 = (SmallVectorBase<slang::ast::OpaqueInstancePath::Entry> *)end(in_RSI);
        begin(in_RDI);
        std::
        uninitialized_move<slang::ast::OpaqueInstancePath::Entry*,slang::ast::OpaqueInstancePath::Entry*>
                  ((Entry *)in_stack_ffffffffffffff80,(Entry *)in_stack_ffffffffffffff78,
                   (Entry *)pSVar8);
        sVar5 = size(in_RSI);
        in_RDI->len = sVar5;
        clear(pSVar8);
      }
      else {
        sVar5 = size(in_RSI);
        if (sVar5 == 0) {
          begin(in_RDI);
        }
        else {
          begin(in_RDI);
          std::ranges::__move_fn::
          operator()<slang::SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>_&,_slang::ast::OpaqueInstancePath::Entry_*>
                    ((__move_fn *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                     (Entry *)in_stack_ffffffffffffff70);
        }
        end(in_RDI);
        std::ranges::__destroy_fn::
        operator()<slang::ast::OpaqueInstancePath::Entry_*,_slang::ast::OpaqueInstancePath::Entry_*>
                  ((__destroy_fn *)in_stack_ffffffffffffff80,(Entry *)in_stack_ffffffffffffff78,
                   (Entry *)in_stack_ffffffffffffff70);
        sVar5 = size(in_RSI);
        in_RDI->len = sVar5;
        clear(in_stack_ffffffffffffff70);
      }
    }
    else {
      cleanup(in_RDI,(EVP_PKEY_CTX *)pSVar8);
      pEVar3 = std::exchange<slang::ast::OpaqueInstancePath::Entry*,decltype(nullptr)>
                         (&in_stack_ffffffffffffff70->data_,(void **)in_stack_ffffffffffffff68);
      in_RDI->data_ = pEVar3;
      uVar4 = std::exchange<unsigned_long,int>
                        ((unsigned_long *)in_stack_ffffffffffffff70,(int *)in_stack_ffffffffffffff68
                        );
      in_RDI->len = uVar4;
      uVar4 = std::exchange<unsigned_long,int>
                        ((unsigned_long *)in_stack_ffffffffffffff70,(int *)in_stack_ffffffffffffff68
                        );
      in_RDI->cap = uVar4;
    }
  }
  return in_RDI;
}

Assistant:

SmallVectorBase<T>& SmallVectorBase<T>::operator=(SmallVectorBase<T>&& rhs) {
    if (this == &rhs)
        return *this;

    // If the rhs isn't small, clear this vector and then steal its buffer.
    if (!rhs.isSmall()) {
        cleanup();
        this->data_ = std::exchange(rhs.data_, nullptr);
        this->len = std::exchange(rhs.len, 0);
        this->cap = std::exchange(rhs.cap, 0);
        return *this;
    }

    // If we already have sufficient space assign the common elements,
    // then destroy any excess.
    if (len >= rhs.size()) {
        iterator newEnd;
        if (rhs.size())
            newEnd = std::ranges::move(rhs, begin()).out;
        else
            newEnd = begin();

        std::ranges::destroy(newEnd, end());
        len = rhs.size();
        rhs.clear();
        return *this;
    }

    if (capacity() < rhs.size()) {
        // If we have to grow to have enough elements, destroy the current elements.
        // This allows us to avoid copying them during the grow.
        clear();
        reserve(rhs.size());
    }
    else if (len) {
        // Otherwise, use assignment for the already-constructed elements.
        std::ranges::move(rhs.begin(), rhs.begin() + len, begin());
    }

    // Move construct the new elements in place.
    std::uninitialized_move(rhs.begin() + len, rhs.end(), begin() + len);
    len = rhs.size();
    rhs.clear();
    return *this;
}